

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::GetToolset
          (cmGlobalGhsMultiGenerator *this,cmMakefile *mf,string *tsp,string *ts)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  char *pcVar4;
  reference __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  string msg_2;
  undefined1 local_188 [8];
  string tryPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string msg_1;
  string local_100;
  int local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string root;
  string *ts_local;
  string *tsp_local;
  cmMakefile *mf_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  root.field_2._8_8_ = ts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GHS_TOOLSET_ROOT",&local_69);
  psVar2 = cmMakefile::GetSafeDefinition(mf,&local_68);
  std::__cxx11::string::string((string *)local_48,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)local_188);
    cmsys::SystemTools::CollapseFullPath
              ((string *)((long)&msg_2.field_2 + 8),(string *)root.field_2._8_8_,(string *)local_48)
    ;
    std::__cxx11::string::operator=((string *)local_188,(string *)(msg_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    bVar1 = cmsys::SystemTools::FileExists((string *)local_188);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)tsp,(string *)local_188);
    }
    else {
      std::operator+(&local_1e8,"GHS toolset \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     &local_1e8,"\" does not exist.");
      std::__cxx11::string::~string((string *)&local_1e8);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1c8);
      std::__cxx11::string::operator=((string *)tsp,"");
      std::__cxx11::string::~string((string *)local_1c8);
    }
    std::__cxx11::string::~string((string *)local_188);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&msg.field_2 + 8));
    bVar1 = cmsys::SystemTools::PathExists((string *)local_48);
    if (bVar1) {
      pcVar4 = (char *)std::__cxx11::string::back();
      if (*pcVar4 != '/') {
        std::__cxx11::string::operator+=((string *)local_48,"/");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"comp_[^;]+",
                 (allocator<char> *)(msg_1.field_2._M_local_buf + 0xf));
      cmSystemTools::Glob((string *)local_48,&local_100,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&msg.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)(msg_1.field_2._M_local_buf + 0xf));
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&msg.field_2 + 8));
      if (bVar1) {
        std::operator+(&local_148,"No GHS toolsets found in GHS_TOOLSET_ROOT \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,&local_148,"\".");
        std::__cxx11::string::~string((string *)&local_148);
        cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_128);
        std::__cxx11::string::operator=((string *)tsp,"");
        std::__cxx11::string::~string((string *)local_128);
      }
      else {
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&msg.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&tryPath.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,__rhs);
        std::__cxx11::string::operator=((string *)tsp,(string *)(tryPath.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(tryPath.field_2._M_local_buf + 8));
      }
      local_dc = 0;
    }
    else {
      std::operator+(&local_d8,"GHS_TOOLSET_ROOT directory \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     &local_d8,"\" does not exist.");
      std::__cxx11::string::~string((string *)&local_d8);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_b8);
      std::__cxx11::string::operator=((string *)tsp,"");
      local_dc = 1;
      std::__cxx11::string::~string((string *)local_b8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&msg.field_2 + 8));
    if (local_dc != 0) goto LAB_0062e0f2;
  }
  local_dc = 0;
LAB_0062e0f2:
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::GetToolset(cmMakefile* mf, std::string& tsp,
                                           const std::string& ts)
{
  /* Determine tsp - full path of the toolset from ts (toolset hint via -T) */

  std::string root = mf->GetSafeDefinition("GHS_TOOLSET_ROOT");

  // Check if `-T` was set by user
  if (ts.empty()) {
    // Enter toolset search mode
    std::vector<std::string> output;

    // Make sure root exists...
    if (!cmSystemTools::PathExists(root)) {
      std::string msg =
        "GHS_TOOLSET_ROOT directory \"" + root + "\" does not exist.";
      mf->IssueMessage(MessageType::FATAL_ERROR, msg);
      tsp = "";
      return;
    }

    // Add a directory separator
    if (root.back() != '/') {
      root += "/";
    }

    // Get all compiler directories in toolset root
    cmSystemTools::Glob(root, "comp_[^;]+", output);

    if (output.empty()) {
      // No compiler directories found
      std::string msg =
        "No GHS toolsets found in GHS_TOOLSET_ROOT \"" + root + "\".";
      mf->IssueMessage(MessageType::FATAL_ERROR, msg);
      tsp = "";
    } else {
      // Use latest? version
      tsp = root + output.back();
    }

  } else {
    // Toolset was provided by user
    std::string tryPath;

    // NOTE: CollapseFullPath() will determine if user toolset was full path or
    //       or relative path.
    tryPath = cmSystemTools::CollapseFullPath(ts, root);
    if (!cmSystemTools::FileExists(tryPath)) {
      std::string msg = "GHS toolset \"" + tryPath + "\" does not exist.";
      mf->IssueMessage(MessageType::FATAL_ERROR, msg);
      tsp = "";
    } else {
      tsp = tryPath;
    }
  }
}